

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::iterate(LayeredRenderCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  int iVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  int *piVar6;
  undefined4 extraout_var_00;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  GLenum *pGVar9;
  Enum<int,_2UL> EVar10;
  undefined1 local_558 [8];
  Surface layer_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  allocator<char> local_4f9;
  string local_4f8;
  ScopedLogSection local_4d8;
  ScopedLogSection section_3;
  undefined1 local_4c8 [4];
  int layerNdx_1;
  Surface layer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  allocator<char> local_469;
  string local_468;
  ScopedLogSection local_448;
  ScopedLogSection section_2;
  undefined1 local_438 [4];
  int layerNdx;
  Surface layer1;
  Surface layer0;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  ScopedLogSection local_3b8;
  ScopedLogSection section_1;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  ScopedLogSection local_360;
  ScopedLogSection section;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  undefined1 local_24 [8];
  StateQueryMemoryWriteGuard<int> state;
  LayeredRenderCase *this_local;
  
  this->m_iteration = this->m_iteration + 1;
  state._4_8_ = this;
  if (this->m_iteration != 1) {
    if ((this->m_test == TEST_LAYER_PROVOKING_VERTEX) && (this->m_provokingVertex == 0x8260)) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"VerifyLayers",&local_3d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_400,"Verify layers 0 and 1",
                 (allocator<char> *)((long)&layer0.m_pixels.m_cap + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_3b8,pTVar7,&local_3d8,&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator((allocator<char> *)((long)&layer0.m_pixels.m_cap + 7));
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      iVar3 = tcu::Vector<int,_2>::x(&this->m_resolveDimensions);
      iVar4 = tcu::Vector<int,_2>::y(&this->m_resolveDimensions);
      tcu::Surface::Surface((Surface *)&layer1.m_pixels.m_cap,iVar3,iVar4);
      iVar3 = tcu::Vector<int,_2>::x(&this->m_resolveDimensions);
      iVar4 = tcu::Vector<int,_2>::y(&this->m_resolveDimensions);
      tcu::Surface::Surface((Surface *)local_438,iVar3,iVar4);
      sampleTextureLayer(this,(Surface *)&layer1.m_pixels.m_cap,0);
      sampleTextureLayer(this,(Surface *)local_438,1);
      bVar2 = verifyProvokingVertexLayers
                        (this,(Surface *)&layer1.m_pixels.m_cap,(Surface *)local_438);
      this->m_allLayersOk = (this->m_allLayersOk & 1U & bVar2) != 0;
      tcu::Surface::~Surface((Surface *)local_438);
      tcu::Surface::~Surface((Surface *)&layer1.m_pixels.m_cap);
      tcu::ScopedLogSection::~ScopedLogSection(&local_3b8);
      for (section_2.m_log._4_4_ = 2; section_2.m_log._4_4_ < this->m_numLayers;
          section_2.m_log._4_4_ = section_2.m_log._4_4_ + 1) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"VerifyLayer",&local_469);
        de::toString<int>((string *)&layer.m_pixels.m_cap,(int *)((long)&section_2.m_log + 4));
        std::operator+(&local_490,"Verify layer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &layer.m_pixels.m_cap);
        tcu::ScopedLogSection::ScopedLogSection(&local_448,pTVar7,&local_468,&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&layer.m_pixels.m_cap);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator(&local_469);
        iVar3 = tcu::Vector<int,_2>::x(&this->m_resolveDimensions);
        iVar4 = tcu::Vector<int,_2>::y(&this->m_resolveDimensions);
        tcu::Surface::Surface((Surface *)local_4c8,iVar3,iVar4);
        sampleTextureLayer(this,(Surface *)local_4c8,section_2.m_log._4_4_);
        bVar2 = verifyEmptyImage(this,(Surface *)local_4c8,true);
        this->m_allLayersOk = (this->m_allLayersOk & 1U & bVar2) != 0;
        tcu::Surface::~Surface((Surface *)local_4c8);
        tcu::ScopedLogSection::~ScopedLogSection(&local_448);
      }
    }
    else {
      section_3.m_log._4_4_ = this->m_iteration + -2;
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,"VerifyLayer",&local_4f9);
      de::toString<int>((string *)&layer_1.m_pixels.m_cap,(int *)((long)&section_3.m_log + 4));
      std::operator+(&local_520,"Verify layer ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &layer_1.m_pixels.m_cap);
      tcu::ScopedLogSection::ScopedLogSection(&local_4d8,pTVar7,&local_4f8,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&layer_1.m_pixels.m_cap);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      iVar3 = tcu::Vector<int,_2>::x(&this->m_resolveDimensions);
      iVar4 = tcu::Vector<int,_2>::y(&this->m_resolveDimensions);
      tcu::Surface::Surface((Surface *)local_558,iVar3,iVar4);
      sampleTextureLayer(this,(Surface *)local_558,section_3.m_log._4_4_);
      bVar2 = verifyLayerContent(this,(Surface *)local_558,section_3.m_log._4_4_);
      this->m_allLayersOk = (this->m_allLayersOk & 1U & bVar2) != 0;
      bVar2 = section_3.m_log._4_4_ < this->m_numLayers + -1;
      if (bVar2) {
        this_local._4_4_ = CONTINUE;
      }
      tcu::Surface::~Surface((Surface *)local_558);
      tcu::ScopedLogSection::~ScopedLogSection(&local_4d8);
      if (bVar2) {
        return this_local._4_4_;
      }
    }
    if ((this->m_allLayersOk & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Detected invalid layer content");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    return STOP;
  }
  if (this->m_test == TEST_LAYER_PROVOKING_VERTEX) {
    gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_24);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar3 = (*pRVar5->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x868);
    piVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_24);
    (*pcVar1)(0x825e,piVar6);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar3 = (*pRVar5->_vptr_RenderContext[3])();
    err = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
    glu::checkError(err,"getInteger(GL_LAYER_PROVOKING_VERTEX)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0xb11);
    bVar2 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)local_24,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (!bVar2) {
      return STOP;
    }
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [29])"GL_LAYER_PROVOKING_VERTEX = ");
    piVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_24);
    EVar10 = glu::getProvokingVertexStr(*piVar6);
    local_1c8[0].m_getName = EVar10.m_getName;
    local_1c8[0].m_value = EVar10.m_value;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1c8);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    piVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_24);
    if (((*piVar6 != 0x8e4d) &&
        (piVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                            ((StateQueryMemoryWriteGuard *)local_24), *piVar6 != 0x8e4e)) &&
       (piVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_24), *piVar6 != 0x8260)) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&section,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&section,
                          (char (*) [67])
                          "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(StateQueryMemoryWriteGuard<int> *)local_24);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "got unexpected provoking vertex value");
      return STOP;
    }
    pGVar9 = (GLenum *)
             gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_24);
    this->m_provokingVertex = *pGVar9;
  }
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"RenderToTexture",&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"Render to layered texture",
             (allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_360,pTVar7,&local_380,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  renderToTexture(this);
  tcu::ScopedLogSection::~ScopedLogSection(&local_360);
  return CONTINUE;
}

Assistant:

LayeredRenderCase::IterateResult LayeredRenderCase::iterate (void)
{
	++m_iteration;

	if (m_iteration == 1)
	{
		if (m_test == TEST_LAYER_PROVOKING_VERTEX)
		{
			// which layer the implementation claims to render to

			gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint> state;

			m_context.getRenderContext().getFunctions().getIntegerv(GL_LAYER_PROVOKING_VERTEX, &state);
			GLU_EXPECT_NO_ERROR(m_context.getRenderContext().getFunctions().getError(), "getInteger(GL_LAYER_PROVOKING_VERTEX)");

			if (!state.verifyValidity(m_testCtx))
				return STOP;

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_LAYER_PROVOKING_VERTEX = " << glu::getProvokingVertexStr(state) << tcu::TestLog::EndMessage;

			if (state != GL_FIRST_VERTEX_CONVENTION &&
				state != GL_LAST_VERTEX_CONVENTION &&
				state != GL_UNDEFINED_VERTEX)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got " << state << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected provoking vertex value");
				return STOP;
			}

			m_provokingVertex = (glw::GLenum)state;
		}

		// render to texture
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "RenderToTexture", "Render to layered texture");

			// render to layered texture with the geometry shader
			renderToTexture();
		}

		return CONTINUE;
	}
	else if (m_test == TEST_LAYER_PROVOKING_VERTEX && m_provokingVertex == GL_UNDEFINED_VERTEX)
	{
		// Verification requires information from another layers, layers not independent
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayers", "Verify layers 0 and 1");
			tcu::Surface				layer0		(m_resolveDimensions.x(), m_resolveDimensions.y());
			tcu::Surface				layer1		(m_resolveDimensions.x(), m_resolveDimensions.y());

			// sample layer to frame buffer
			sampleTextureLayer(layer0, 0);
			sampleTextureLayer(layer1, 1);

			m_allLayersOk &= verifyProvokingVertexLayers(layer0, layer1);
		}

		// Other layers empty
		for (int layerNdx = 2; layerNdx < m_numLayers; ++layerNdx)
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayer", "Verify layer " + de::toString(layerNdx));
			tcu::Surface				layer		(m_resolveDimensions.x(), m_resolveDimensions.y());

			// sample layer to frame buffer
			sampleTextureLayer(layer, layerNdx);

			// verify
			m_allLayersOk &= verifyEmptyImage(layer);
		}
	}
	else
	{
		// Layers independent

		const int					layerNdx	= m_iteration - 2;
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayer", "Verify layer " + de::toString(layerNdx));
		tcu::Surface				layer		(m_resolveDimensions.x(), m_resolveDimensions.y());

		// sample layer to frame buffer
		sampleTextureLayer(layer, layerNdx);

		// verify
		m_allLayersOk &= verifyLayerContent(layer, layerNdx);

		if (layerNdx < m_numLayers-1)
			return CONTINUE;
	}

	// last iteration
	if (m_allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected invalid layer content");

	return STOP;
}